

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O2

int __thiscall Qclass::rewardfunc(Qclass *this,int lastAction,int x,int y)

{
  int iVar1;
  
  iVar1 = (*(code *)(&DAT_00105028 + *(int *)(&DAT_00105028 + (ulong)(uint)lastAction * 4)))();
  return iVar1;
}

Assistant:

int Qclass::rewardfunc(int lastAction, int x, int y) {
  int reward;
  if (lastAction == 0) {
    // High positive reward for reaching the goal state
    if (x + 1 == goal_x && y == goal_y) {
      reward = 1000;
    } else {
      // High negative reward for exceeding map boundaries
      // High negative reward when obstacle is present
      if (x + 1 <= 49) {
        reward = grid[x + 1][y] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x + 1][y] == 1) {
        restart = true;
      }
    }
  }
  if (lastAction == 1) {
    if (x - 1 == goal_x && y == goal_y) {
      reward = 1000;
    } else {
      if (x - 1 >= 0) {
        reward = grid[x - 1][y] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x - 1][y] == 1) {
        restart = true;
      }
    }
  }
  if (lastAction == 2) {
    if (x == goal_x && y + 1 == goal_y) {
      reward = 1000;
    } else {
      if (y + 1 <= 49) {
        reward = grid[x][y + 1] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x][y + 1] == 1) {
        restart = true;
      }
    }
  }
  if (lastAction == 3) {
    if (x == goal_x && y - 1 == goal_y) {
      reward = 1000;
    } else {
      if (y - 1 >= 0) {
        reward = grid[x][y - 1] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x][y - 1] == 1) {
        restart = true;
      }
    }
  }
  return reward;
}